

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransferFunction.cpp
# Opt level: O0

void __thiscall
rtb::Filter::TransferFunction<double>::getBode
          (TransferFunction<double> *this,vector<double,_std::allocator<double>_> *xValues,
          vector<double,_std::allocator<double>_> *gain,
          vector<double,_std::allocator<double>_> *phase)

{
  uint uVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  double dVar3;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double w;
  vector<double,_std::allocator<double>_> *pvStack_28;
  uint i;
  vector<double,_std::allocator<double>_> *phase_local;
  vector<double,_std::allocator<double>_> *gain_local;
  vector<double,_std::allocator<double>_> *xValues_local;
  TransferFunction<double> *this_local;
  
  pvStack_28 = phase;
  phase_local = gain;
  gain_local = xValues;
  xValues_local = (vector<double,_std::allocator<double>_> *)this;
  std::vector<double,_std::allocator<double>_>::clear(xValues);
  std::vector<double,_std::allocator<double>_>::clear(phase_local);
  std::vector<double,_std::allocator<double>_>::clear(pvStack_28);
  w._4_4_ = 1;
  while( true ) {
    uVar1 = w._4_4_;
    dVar3 = ceil(this->samplingFrequency_ * 0.5);
    if ((uint)(long)dVar3 <= uVar1) break;
    local_38 = (6.283185307179586 / this->samplingFrequency_) * (double)w._4_4_;
    local_40 = (double)w._4_4_;
    std::vector<double,_std::allocator<double>_>::push_back(gain_local,&local_40);
    pvVar2 = phase_local;
    local_48 = getGainAt(this,local_38);
    std::vector<double,_std::allocator<double>_>::push_back(pvVar2,&local_48);
    pvVar2 = pvStack_28;
    local_50 = getPhaseAt(this,local_38);
    std::vector<double,_std::allocator<double>_>::push_back(pvVar2,&local_50);
    w._4_4_ = w._4_4_ + 1;
  }
  return;
}

Assistant:

void TransferFunction<T>::getBode(std::vector<double>& xValues, std::vector<double>& gain, std::vector<double>& phase) const {

            xValues.clear();
            gain.clear();
            phase.clear();

            for (unsigned i{ 1 }; i < static_cast<unsigned>(ceil(samplingFrequency_ / 2.)); ++i) {
                double w{ 2 * M_PI / samplingFrequency_ * i };
                xValues.push_back(i);
                gain.push_back(getGainAt(w));
                phase.push_back(getPhaseAt(w));
            }
        }